

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_2014f3::LineEdit::~LineEdit(LineEdit *this)

{
  *(undefined ***)this = &PTR_metaObject_00166f38;
  *(undefined ***)&this->field_0x10 = &PTR__LineEdit_001670f0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->origText).d);
  QLineEdit::~QLineEdit(&this->super_QLineEdit);
  return;
}

Assistant:

Q_OBJECT
public:
    LineEdit(QWidget* parent = nullptr)
        : QLineEdit(parent)
    {
        setContextMenuPolicy(Qt::NoContextMenu);
        connect(this, &LineEdit::returnPressed, this, &LineEdit::handleReturnPressed);
    }